

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

Matrix<double,_2,_2> *
gl4cts::Math::inverse<2>(Matrix<double,_2,_2> *__return_storage_ptr__,Matrix<double,_2,_2> *matrix)

{
  tcu *this;
  Matrix<double,_2,_2> *mat;
  double dVar1;
  GLdouble inv_det;
  GLdouble det;
  undefined1 local_58 [8];
  Matrix<double,_2,_2> adjugate;
  Matrix<double,_2,_2> cof;
  Matrix<double,_2,_2> *matrix_local;
  Matrix<double,_2,_2> *result;
  
  this = (tcu *)(adjugate.m_data.m_data[1].m_data + 1);
  cofactors<2>((Matrix<double,_2,_2> *)this,matrix);
  tcu::transpose<double,2,2>((Matrix<double,_2,_2> *)local_58,this,mat);
  dVar1 = determinant<double>(matrix);
  tcu::operator*(__return_storage_ptr__,(Matrix<double,_2,_2> *)local_58,1.0 / dVar1);
  tcu::Matrix<double,_2,_2>::~Matrix((Matrix<double,_2,_2> *)local_58);
  tcu::Matrix<double,_2,_2>::~Matrix((Matrix<double,_2,_2> *)(adjugate.m_data.m_data[1].m_data + 1))
  ;
  return __return_storage_ptr__;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Size, Size> inverse(const tcu::Matrix<glw::GLdouble, Size, Size>& matrix)
{
	const tcu::Matrix<glw::GLdouble, Size, Size> cof	  = cofactors(matrix);
	const tcu::Matrix<glw::GLdouble, Size, Size> adjugate = tcu::transpose(cof);
	const glw::GLdouble det		= determinant(matrix);
	const glw::GLdouble inv_det = 1.0 / det;

	tcu::Matrix<glw::GLdouble, Size, Size> result = adjugate * inv_det;

	return result;
}